

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall Statements::evaluate(Statements *this,SymTab *symTab)

{
  bool bVar1;
  Functions *this_00;
  reference ppSVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppFVar5;
  Function *local_128;
  Function *local_110;
  Function *local_f0;
  vector<Statement_*,_std::allocator<Statement_*>_> local_c8;
  value_type local_b0;
  value_type local_a8;
  Function *function;
  undefined1 local_98 [4];
  int i;
  vector<Function_*,_std::allocator<Function_*>_> functionStack;
  vector<Statement_*,_std::allocator<Statement_*>_> stack;
  Function *local_50;
  Statement *s;
  iterator __end1;
  iterator __begin1;
  vector<Statement_*,_std::allocator<Statement_*>_> *__range1;
  Functions *funcs;
  SymTab *symTab_local;
  Statements *this_local;
  
  this_00 = (Functions *)operator_new(0x18);
  Functions::Functions(this_00);
  __end1 = std::vector<Statement_*,_std::allocator<Statement_*>_>::begin(&this->_statements);
  s = (Statement *)std::vector<Statement_*,_std::allocator<Statement_*>_>::end(&this->_statements);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>
                                     *)&s), bVar1) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>
              ::operator*(&__end1);
    local_50 = (Function *)*ppSVar2;
    if (local_50 != (Function *)0x0) {
      if (((local_50->super_Statement).isFunction & 1U) == 0) {
        Functions::getFunctionStack
                  ((vector<Function_*,_std::allocator<Function_*>_> *)
                   &stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,this_00);
        bVar1 = std::vector<Function_*,_std::allocator<Function_*>_>::empty
                          ((vector<Function_*,_std::allocator<Function_*>_> *)
                           &stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<Function_*,_std::allocator<Function_*>_>::~vector
                  ((vector<Function_*,_std::allocator<Function_*>_> *)
                   &stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          if (local_50 == (Function *)0x0) {
            local_110 = (Function *)0x0;
          }
          else {
            local_110 = (Function *)
                        __dynamic_cast(local_50,&Statement::typeinfo,&Function::typeinfo,0);
          }
          bVar1 = Functions::findFunction(this_00,local_110);
          if (bVar1) {
            if (local_50 == (Function *)0x0) {
              local_128 = (Function *)0x0;
            }
            else {
              local_128 = (Function *)
                          __dynamic_cast(local_50,&Statement::typeinfo,&Function::typeinfo,0);
            }
            local_50 = Functions::returnFunction(this_00,local_128);
          }
          std::vector<Statement_*,_std::allocator<Statement_*>_>::vector
                    ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                     &functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          Functions::getFunctionStack
                    ((vector<Function_*,_std::allocator<Function_*>_> *)local_98,this_00);
          for (function._4_4_ = 0; uVar3 = (ulong)function._4_4_,
              sVar4 = std::vector<Function_*,_std::allocator<Function_*>_>::size
                                ((vector<Function_*,_std::allocator<Function_*>_> *)local_98),
              uVar3 < sVar4; function._4_4_ = function._4_4_ + 1) {
            ppFVar5 = std::vector<Function_*,_std::allocator<Function_*>_>::operator[]
                                ((vector<Function_*,_std::allocator<Function_*>_> *)local_98,
                                 (long)function._4_4_);
            local_b0 = *ppFVar5;
            local_a8 = local_b0;
            std::vector<Statement_*,_std::allocator<Statement_*>_>::push_back
                      ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                       &functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&local_b0);
          }
          std::vector<Statement_*,_std::allocator<Statement_*>_>::vector
                    (&local_c8,
                     (vector<Statement_*,_std::allocator<Statement_*>_> *)
                     &functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          (*(local_50->super_Statement)._vptr_Statement[2])(local_50,&local_c8);
          std::vector<Statement_*,_std::allocator<Statement_*>_>::~vector(&local_c8);
          std::vector<Function_*,_std::allocator<Function_*>_>::~vector
                    ((vector<Function_*,_std::allocator<Function_*>_> *)local_98);
          std::vector<Statement_*,_std::allocator<Statement_*>_>::~vector
                    ((vector<Statement_*,_std::allocator<Statement_*>_> *)
                     &functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        (*(local_50->super_Statement)._vptr_Statement[1])(local_50,symTab);
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        if (local_50 == (Function *)0x0) {
          local_f0 = (Function *)0x0;
        }
        else {
          local_f0 = (Function *)__dynamic_cast(local_50,&Statement::typeinfo,&Function::typeinfo,0)
          ;
        }
        Functions::addFunction(this_00,local_f0);
      }
    }
    __gnu_cxx::
    __normal_iterator<Statement_**,_std::vector<Statement_*,_std::allocator<Statement_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Statements::evaluate(SymTab &symTab) {
    //std::cout << "Evaluating Statements...\n";
    auto *funcs= new Functions();
    for (auto s: _statements) {
        if(s == NULL) continue;
        if(s->isFunction){
            funcs->addFunction(dynamic_cast<Function *>(s));
        } else {
            if(!funcs->getFunctionStack().empty()) {
                if(funcs->findFunction(dynamic_cast<Function *>(s))) {
                    s = funcs->returnFunction(dynamic_cast<Function *>(s));
                }
                std::vector<Statement*>stack;
                std::vector<Function*>functionStack = funcs->getFunctionStack();
                //funcs->setStack(functionStack);
                for(int i = 0; i < functionStack.size();i++){
                    Function *function = functionStack[i];
                    stack.push_back(function);
                }
                s->passStack(stack);
                //s->passFunctions(reinterpret_cast<Statement*>(funcs->returnFunction(dynamic_cast<Function *>(s))));

            }
            s->evaluate(symTab);
            std::cout << std::endl;
        }
    }
}